

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

Result * __thiscall CoreML::Model::save(Result *__return_storage_ptr__,Model *this,ostream *out)

{
  bool bVar1;
  ulong uVar2;
  element_type *formatObj;
  undefined1 local_80 [8];
  Result r;
  allocator<char> local_41;
  string local_40;
  ostream *local_20;
  ostream *out_local;
  Model *this_local;
  
  local_20 = out;
  out_local = (ostream *)this;
  this_local = (Model *)__return_storage_ptr__;
  uVar2 = std::ios::good();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unable to open file for write",&local_41);
    Result::Result(__return_storage_ptr__,UNABLE_TO_OPEN_FILE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    downgradeSpecificationVersion(this);
    validate((Result *)local_80,this);
    bVar1 = Result::good((Result *)local_80);
    if (bVar1) {
      formatObj = std::
                  __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m_spec);
      saveSpecification<CoreML::Specification::Model>(__return_storage_ptr__,formatObj,local_20);
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_80);
    }
    Result::~Result((Result *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Result Model::save(std::ostream& out) {
        if (!out.good()) {
            return Result(ResultType::UNABLE_TO_OPEN_FILE,
                          "unable to open file for write");
        }

        // Before saving the model, always downgrade the specification version to
        // the minimal version supporting everything this model needs
        downgradeSpecificationVersion();

        // validate on save
        Result r = validate();
        if (!r.good()) {
            return r;
        }
        
        return saveSpecification(*m_spec, out);
    }